

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O1

void test_ext(fitsfile *infits,FILE *out,FitsHdu *hduptr)

{
  int iVar1;
  FitsKey **ppFVar2;
  FitsKey *pFVar3;
  double dVar4;
  char **ppcVar5;
  int iVar6;
  size_t __nmemb;
  void *pvVar7;
  long lVar8;
  ushort **ppuVar9;
  uint uVar10;
  uint uVar11;
  void *pvVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  
  iVar1 = hduptr->tkeys;
  __nmemb = (size_t)iVar1;
  ppFVar2 = hduptr->kwds;
  uVar13 = hduptr->hdunum;
  if (1 < (int)uVar13) {
    iVar16 = uVar13 + 1;
    do {
      iVar6 = test_hduname(uVar13,iVar16 - 2U);
      if (iVar6 != 0) {
        sprintf(comm,"The HDU %d and %d have identical type/name/version",(ulong)uVar13,
                (ulong)(iVar16 - 2U));
        wrtwrn(out,comm,0);
      }
      iVar16 = iVar16 + -1;
    } while (2 < iVar16);
  }
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"PCOUNT",7);
  ptemp = temp;
  pvVar7 = bsearch(&ptemp,tmpkwds,__nmemb,8,compstre);
  if (pvVar7 == (void *)0x0) {
    uVar13 = 0xffffff9d;
  }
  else {
    uVar15 = (ulong)((long)pvVar7 - (long)ppcVar5) >> 3;
    uVar11 = (uint)uVar15;
    if ((int)uVar11 < 2) {
      uVar10 = 1;
      uVar13 = uVar11;
    }
    else {
      uVar10 = 1;
      uVar15 = uVar15 & 0xffffffff;
      pvVar12 = pvVar7;
      do {
        uVar13 = (uint)uVar15;
        pvVar12 = (void *)((long)pvVar12 + -8);
        iVar16 = compstre(&ptemp,pvVar12);
        if (iVar16 != 0) goto LAB_0010fef1;
        uVar15 = (ulong)(uVar13 - 1);
        uVar10 = uVar10 + 1;
      } while (uVar13 - 1 != 1);
      uVar13 = 1;
      uVar10 = uVar11;
    }
LAB_0010fef1:
    if ((int)(uVar13 + uVar10) < iVar1) {
      iVar16 = uVar13 + uVar10;
      do {
        iVar16 = iVar16 + 1;
        pvVar7 = (void *)((long)pvVar7 + 8);
        iVar6 = compstre(&ptemp,pvVar7);
        if (iVar6 != 0) break;
      } while (iVar16 < iVar1);
    }
  }
  if ((int)uVar13 < 0) {
    builtin_strncpy(errmes + 0x10,"PCOUNT keyword.",0x10);
    builtin_strncpy(errmes,"cannot find the ",0x10);
    wrterr(out,errmes,1);
  }
  else {
    pFVar3 = hduptr->kwds[uVar13];
    iVar16 = check_int(pFVar3,out);
    if (iVar16 != 0) {
      dVar4 = atof(pFVar3->kvalue);
      hduptr->pcount = (long)dVar4;
    }
    if (pFVar3->kindex != hduptr->naxis + 4) {
      sprintf(errmes,"PCOUNT is not in record %d of the header.");
      wrterr(out,errmes,1);
    }
    check_fixed_int(cards[(long)pFVar3->kindex + -1],out);
  }
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"GCOUNT",7);
  ptemp = temp;
  pvVar7 = bsearch(&ptemp,tmpkwds,__nmemb,8,compstre);
  if (pvVar7 == (void *)0x0) {
    uVar13 = 0xffffff9d;
  }
  else {
    uVar15 = (ulong)((long)pvVar7 - (long)ppcVar5) >> 3;
    uVar11 = (uint)uVar15;
    if ((int)uVar11 < 2) {
      uVar13 = uVar11;
      uVar10 = 1;
    }
    else {
      uVar10 = 1;
      uVar15 = uVar15 & 0xffffffff;
      pvVar12 = pvVar7;
      do {
        uVar13 = (uint)uVar15;
        pvVar12 = (void *)((long)pvVar12 + -8);
        iVar16 = compstre(&ptemp,pvVar12);
        if (iVar16 != 0) goto LAB_001100b6;
        uVar15 = (ulong)(uVar13 - 1);
        uVar10 = uVar10 + 1;
      } while (uVar13 - 1 != 1);
      uVar13 = 1;
      uVar10 = uVar11;
    }
LAB_001100b6:
    if ((int)(uVar13 + uVar10) < iVar1) {
      iVar16 = uVar13 + uVar10;
      do {
        iVar16 = iVar16 + 1;
        pvVar7 = (void *)((long)pvVar7 + 8);
        iVar6 = compstre(&ptemp,pvVar7);
        if (iVar6 != 0) break;
      } while (iVar16 < iVar1);
    }
  }
  if ((int)uVar13 < 0) {
    builtin_strncpy(errmes + 0x10,"GCOUNT keyword.",0x10);
    builtin_strncpy(errmes,"cannot find the ",0x10);
    wrterr(out,errmes,1);
  }
  else {
    pFVar3 = hduptr->kwds[uVar13];
    iVar16 = check_int(pFVar3,out);
    if (iVar16 != 0) {
      lVar8 = strtol(pFVar3->kvalue,(char **)0x0,10);
      hduptr->gcount = (int)lVar8;
    }
    if (pFVar3->kindex != hduptr->naxis + 5) {
      sprintf(errmes,"GCOUNT is not in record %d of the header.");
      wrterr(out,errmes,1);
    }
    check_fixed_int(cards[(long)pFVar3->kindex + -1],out);
  }
  lVar8 = 0;
  do {
    strcpy(temp,(char *)((long)&DAT_001d0a00 + (long)(int)(&DAT_001d0a00)[lVar8]));
    ppcVar5 = tmpkwds;
    ptemp = temp;
    pvVar7 = bsearch(&ptemp,tmpkwds,__nmemb,8,compstre);
    if (pvVar7 == (void *)0x0) {
      uVar13 = 0xffffff9d;
    }
    else {
      uVar15 = (ulong)((long)pvVar7 - (long)ppcVar5) >> 3;
      uVar11 = (uint)uVar15;
      if ((int)uVar11 < 2) {
        uVar10 = 1;
        uVar13 = uVar11;
      }
      else {
        uVar10 = 1;
        uVar15 = uVar15 & 0xffffffff;
        pvVar12 = pvVar7;
        do {
          uVar13 = (uint)uVar15;
          pvVar12 = (void *)((long)pvVar12 + -8);
          iVar16 = compstre(&ptemp,pvVar12);
          if (iVar16 != 0) goto LAB_00110281;
          uVar15 = (ulong)(uVar13 - 1);
          uVar10 = uVar10 + 1;
        } while (uVar13 - 1 != 1);
        uVar13 = 1;
        uVar10 = uVar11;
      }
LAB_00110281:
      if ((int)(uVar10 + uVar13) < iVar1) {
        iVar16 = uVar10 + uVar13;
        do {
          iVar16 = iVar16 + 1;
          pvVar7 = (void *)((long)pvVar7 + 8);
          iVar6 = compstre(&ptemp,pvVar7);
          if (iVar6 != 0) break;
        } while (iVar16 < iVar1);
      }
    }
    if (-1 < (int)uVar13) {
      sprintf(errmes,"Keyword #%d, %s is not allowed in extensions.",
              (ulong)(uint)hduptr->kwds[uVar13]->kindex);
      wrterr(out,errmes,1);
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  lVar8 = 0;
  do {
    strcpy(temp,(char *)((long)&DAT_001d0a0c + (long)(int)(&DAT_001d0a0c)[lVar8]));
    ppcVar5 = tmpkwds;
    ptemp = temp;
    pvVar7 = bsearch(&ptemp,tmpkwds,__nmemb,8,compstrp);
    if (pvVar7 == (void *)0x0) {
      uVar13 = 0xffffff9d;
      iVar16 = -999;
    }
    else {
      uVar15 = (ulong)((long)pvVar7 - (long)ppcVar5) >> 3;
      uVar13 = (uint)uVar15;
      if ((int)uVar13 < 2) {
        uVar15 = 1;
      }
      else {
        uVar11 = 1;
        uVar17 = uVar15 & 0xffffffff;
        pvVar12 = pvVar7;
        do {
          uVar13 = (uint)uVar17;
          pvVar12 = (void *)((long)pvVar12 + -8);
          iVar16 = compstrp(&ptemp,pvVar12);
          if (iVar16 != 0) {
            uVar15 = (ulong)uVar11;
            goto LAB_001103cc;
          }
          uVar17 = (ulong)(uVar13 - 1);
          uVar11 = uVar11 + 1;
        } while (uVar13 - 1 != 1);
        uVar13 = 1;
      }
LAB_001103cc:
      iVar16 = (int)uVar15;
      if ((int)(uVar13 + (int)uVar15) < iVar1) {
        do {
          iVar14 = (int)uVar15;
          pvVar7 = (void *)((long)pvVar7 + 8);
          iVar6 = compstrp(&ptemp,pvVar7);
          iVar16 = iVar14;
          if (iVar6 != 0) break;
          uVar15 = (ulong)(iVar14 + 1);
          iVar16 = iVar1 - uVar13;
        } while ((int)(uVar13 + iVar14 + 1) < iVar1);
      }
    }
    if ((-1 < (int)uVar13) && (0 < iVar16)) {
      ppuVar9 = __ctype_b_loc();
      uVar15 = (ulong)uVar13;
      do {
        if ((*(byte *)((long)*ppuVar9 + (long)ppFVar2[uVar15]->kname[5] * 2 + 1) & 8) != 0) {
          sprintf(errmes,"Keyword #%d, %s is only allowed in Random Groups structures.",
                  (ulong)(uint)hduptr->kwds[uVar15]->kindex);
          wrterr(out,errmes,1);
        }
        uVar15 = uVar15 + 1;
      } while ((int)uVar15 < (int)(iVar16 + uVar13));
    }
    lVar8 = lVar8 + 1;
    if (lVar8 == 4) {
      return;
    }
  } while( true );
}

Assistant:

void test_ext(fitsfile *infits, 	/* input fits file   */ 
	     FILE*     out,	/* output ascii file */
	     FitsHdu  *hduptr	/* information about header */
            ) 
{
    FitsKey *pkey;
    FitsKey **kwds;
    int  i,j,k,n;
    int numusrkey;
    char *exlkey[] = {"SIMPLE","EXTEND", "BLOCKED", }; 
    int nexlkey = 3;
    char *exlnkey[] = {"PTYPE","PSCAL", "PZERO", "GROUPS", }; 
    int nexlnkey = 4;
    int hdunum;
    char *p;

    numusrkey = hduptr->tkeys;
    kwds = hduptr->kwds;
    hdunum = hduptr->hdunum;

    /* check the duplicate extensions */
    for (i = hdunum - 1; i > 0; i--) { 
        if(test_hduname(hdunum,i)) { 
            sprintf(comm, 
	    "The HDU %d and %d have identical type/name/version", 
                hdunum,i);
            wrtwrn(out,comm,0);
        }
    }

    /* check the position of the PCOUNT  */
    strcpy(temp,"PCOUNT");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n); 
    if( k < 0) { 
	sprintf(errmes,"cannot find the PCOUNT keyword.");
        wrterr(out,errmes,1);
    } 
    else {
        pkey = hduptr->kwds[k]; 
	if(check_int(pkey,out)) 
	    hduptr->pcount = (LONGLONG) atof(pkey->kvalue);
        if( pkey->kindex != 4 + hduptr->naxis ) {
	     sprintf(errmes,"PCOUNT is not in record %d of the header.",
                 hduptr->naxis + 4); 
             wrterr(out,errmes,1);
        } 

        check_fixed_int(cards[pkey->kindex - 1], out);
    }

    /* check the position of the GCOUNT */
    strcpy(temp,"GCOUNT");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n); 
    if( k < 0) { 
	sprintf(errmes,"cannot find the GCOUNT keyword.");
        wrterr(out,errmes,1);
    } 
    else {
        pkey = hduptr->kwds[k]; 
	if(check_int(pkey,out)) 
	    hduptr->gcount = (int) strtol(pkey->kvalue,NULL,10);
        if( pkey->kindex != 5 + hduptr->naxis ) {
	     sprintf(errmes,"GCOUNT is not in record %d of the header.",
                 hduptr->naxis + 5); 
             wrterr(out,errmes,1);
        } 

        check_fixed_int(cards[pkey->kindex - 1], out);
    }

    for (i = 0; i < nexlkey; i++) {
        strcpy(temp,exlkey[i]);
    	ptemp = temp;
    	key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n);  
    	if(k > -1) {
            pkey = hduptr->kwds[k];
            sprintf( errmes, 
               "Keyword #%d, %s is not allowed in extensions.",
               pkey->kindex,pkey->kname);
            wrterr(out,errmes,1);
        } 
    }

    for (i = 0; i < nexlnkey; i++) {
        strcpy(temp,exlnkey[i]);
    	ptemp = temp;
    	key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    	if(k > -1) {

          for (j = k; j< k + n ; j++){ 
	    p = kwds[j]->kname; 
	    p += 5;
            if(!isdigit((int)*p)) continue;

            pkey = hduptr->kwds[j];
            sprintf( errmes, 
               "Keyword #%d, %s is only allowed in Random Groups structures.",
               pkey->kindex,pkey->kname);
            wrterr(out,errmes,1);
          }
        } 
    }

    return;

}